

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressionAttribute.cpp
# Opt level: O3

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::Compression>::readValueFrom
          (TypedAttribute<Imf_2_5::Compression> *this,IStream *is,int size,int version)

{
  undefined8 in_RAX;
  byte bVar1;
  undefined4 in_register_0000000c;
  byte local_11;
  
  local_11 = (byte)((ulong)in_RAX >> 0x38);
  (*is->_vptr_IStream[3])(is,&local_11,1,CONCAT44(in_register_0000000c,version));
  bVar1 = 10;
  if (local_11 < 10) {
    bVar1 = local_11;
  }
  this->_value = (uint)bVar1;
  return;
}

Assistant:

void
CompressionAttribute::readValueFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int size, int version)
{
    unsigned char tmp;
    Xdr::read <StreamIO> (is, tmp);

    //
    // prevent invalid values being written to Compressin enum
    // by forcing all unknown types to NUM_COMPRESSION_METHODS which is also an invalid
    // pixel type, but can be used as a PixelType enum value
    // (Header::sanityCheck will throw an exception when files with invalid Compression types are read)
    //

    if (tmp!= NO_COMPRESSION &&
      tmp != RLE_COMPRESSION &&
      tmp != ZIPS_COMPRESSION &&
      tmp != ZIP_COMPRESSION &&
      tmp != PIZ_COMPRESSION &&
      tmp != PXR24_COMPRESSION &&
      tmp != B44_COMPRESSION &&
      tmp != B44A_COMPRESSION &&
      tmp != DWAA_COMPRESSION &&
      tmp != DWAB_COMPRESSION)
    {
        tmp = NUM_COMPRESSION_METHODS;
    }

    _value = Compression (tmp);
}